

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall
ethash_params_init_genesis_check::test_method(ethash_params_init_genesis_check *this)

{
  uint64_t cache_size;
  uint64_t full_size;
  long local_1b8;
  undefined1 local_1b0 [8];
  undefined8 local_1a8;
  shared_count sStack_1a0;
  undefined **local_198;
  undefined1 local_190;
  undefined8 *local_188;
  char *local_180;
  undefined **local_178;
  undefined1 local_170;
  undefined ***local_168;
  uint64_t *local_160;
  undefined **local_158;
  undefined1 local_150;
  undefined ***local_148;
  long *local_140;
  undefined **local_138;
  undefined1 local_130;
  undefined ***local_128;
  char *local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined ***local_108;
  char *local_100;
  uint64_t local_f8;
  uint64_t local_f0;
  undefined4 local_e4;
  undefined **local_e0;
  undefined1 local_d8;
  undefined ***local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_f0 = ethash_get_datasize(0);
  local_f8 = ethash_get_cachesize(0);
  local_40 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xa0);
  local_1b0[0] = local_f0 < 0x40000000;
  local_1a8 = 0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_168 = &local_198;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_0013ead0;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "\nfull size: ";
  local_108 = &local_178;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_0013eb10;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_0013eb50;
  local_100 = "\n";
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_0013eb90;
  local_120 = "should be less than or equal to: ";
  local_140 = &local_1b8;
  local_1b8 = CONCAT44(local_1b8._4_4_,0x40000000);
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_0013ebd0;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0013ec10;
  local_c8 = "\n";
  local_60 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_58 = "";
  local_160 = &local_f0;
  local_148 = &local_138;
  local_128 = &local_118;
  local_d0 = &local_158;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  local_70 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0xa3);
  local_1b0[0] = local_f0 - 0x3ffff600 < 0xffffffffc0000000;
  local_1a8 = 0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_0013ec50;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "\nfull size + 20*MIX_BYTES: ";
  local_1b8 = local_f0 + 0xa00;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_0013ec90;
  local_168 = &local_198;
  local_160 = (uint64_t *)&local_1b8;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_0013ecd0;
  local_108 = &local_178;
  local_100 = "\n";
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_0013ed10;
  local_120 = "should be greater than or equal to: ";
  local_140 = (long *)&local_e4;
  local_e4 = 0x40000000;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_0013ed50;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0013ed90;
  local_c8 = "\n";
  local_90 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_88 = "";
  local_148 = &local_138;
  local_128 = &local_118;
  local_d0 = &local_158;
  boost::test_tools::tt_detail::report_assertion(local_1b0,&local_e0,&local_90,0xa3,2,1,0);
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  local_a0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0xa6);
  local_160 = &local_f8;
  local_1b0[0] = local_f8 < 0x2000000;
  local_1a8 = 0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_0013edd0;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "\ncache size: ";
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_0013ee10;
  local_168 = &local_198;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_0013ee50;
  local_108 = &local_178;
  local_100 = "\n";
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_0013ee90;
  local_120 = "should be less than or equal to: ";
  local_1b8 = CONCAT44(local_1b8._4_4_,0x2000000);
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_0013eed0;
  local_140 = &local_1b8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0013ef10;
  local_c8 = "\n";
  local_c0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_b8 = "";
  local_148 = &local_138;
  local_128 = &local_118;
  local_d0 = &local_158;
  boost::test_tools::tt_detail::report_assertion(local_1b0,&local_e0,&local_c0,0xa6,2,1,0);
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ethash_params_init_genesis_check) {
	uint64_t full_size = ethash_get_datasize(0);
	uint64_t cache_size = ethash_get_cachesize(0);
	BOOST_REQUIRE_MESSAGE(full_size < ETHASH_DATASET_BYTES_INIT,
			"\nfull size: " << full_size << "\n"
					<< "should be less than or equal to: " << ETHASH_DATASET_BYTES_INIT << "\n");
	BOOST_REQUIRE_MESSAGE(full_size + 20 * ETHASH_MIX_BYTES >= ETHASH_DATASET_BYTES_INIT,
			"\nfull size + 20*MIX_BYTES: " << full_size + 20 * ETHASH_MIX_BYTES << "\n"
					<< "should be greater than or equal to: " << ETHASH_DATASET_BYTES_INIT << "\n");
	BOOST_REQUIRE_MESSAGE(cache_size < ETHASH_DATASET_BYTES_INIT / 32,
			"\ncache size: " << cache_size << "\n"
					<< "should be less than or equal to: " << ETHASH_DATASET_BYTES_INIT / 32 << "\n");
}